

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::EmptyCharsetBitstateAssumptions(void)

{
  bool bVar1;
  long lVar2;
  StringPiece local_228;
  StringPiece group [6];
  undefined1 local_1b0 [384];
  
  lVar2 = 8;
  do {
    *(undefined8 *)((long)group + lVar2 + -8) = 0;
    *(undefined4 *)((long)&group[0].ptr_ + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x68);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    RE2::RE2((RE2 *)local_1b0,
             (char *)((long)&_ZZN3re231EmptyCharsetBitstateAssumptionsEvE11nop_empties_rel +
                     (long)*(int *)((long)&
                                          _ZZN3re231EmptyCharsetBitstateAssumptionsEvE11nop_empties_rel
                                   + lVar2)));
    local_228.ptr_ = "";
    local_228.length_ = 0;
    bVar1 = RE2::Match((RE2 *)local_1b0,&local_228,0,0,UNANCHORED,group,6);
    RE2::~RE2((RE2 *)local_1b0);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x20c);
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Check failed: RE2(nop_empties[i]).Match(\"\", 0, 0, RE2::UNANCHORED, group, 6)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
    }
  }
  return;
}

Assistant:

TEST(EmptyCharset, BitstateAssumptions) {
  // Captures trigger use of Bitstate.
  static const char *nop_empties[] = {
    "((((()))))" "[^\\S\\s]?",
    "((((()))))" "([^\\S\\s])?",
    "((((()))))" "([^\\S\\s]|[^\\S\\s])?",
    "((((()))))" "(([^\\S\\s]|[^\\S\\s])|)"
  };
  StringPiece group[6];
  for (int i = 0; i < arraysize(nop_empties); i++)
    CHECK(RE2(nop_empties[i]).Match("", 0, 0, RE2::UNANCHORED, group, 6));
}